

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsInstanceOf(JsValueRef object,JsValueRef constructor,bool *result)

{
  anon_class_24_3_a38a6397 fn;
  JsErrorCode JVar1;
  bool **in_stack_ffffffffffffffc0;
  bool *local_20;
  bool *result_local;
  JsValueRef constructor_local;
  JsValueRef object_local;
  
  fn.constructor = &local_20;
  fn.object = &result_local;
  fn.result = in_stack_ffffffffffffffc0;
  local_20 = result;
  result_local = (bool *)constructor;
  constructor_local = object;
  JVar1 = ContextAPIWrapper<false,JsInstanceOf::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsInstanceOf(_In_ JsValueRef object, _In_ JsValueRef constructor, _Out_ bool *result) {
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTInstanceOf, object, constructor);

        VALIDATE_INCOMING_REFERENCE(object, scriptContext);
        VALIDATE_INCOMING_REFERENCE(constructor, scriptContext);
        PARAM_NOT_NULL(result);

        Js::Var value = Js::JavascriptOperators::OP_IsInst(object, constructor, scriptContext, nullptr);
        *result = !!Js::VarTo<Js::JavascriptBoolean>(value)->GetValue();

        return JsNoError;
    });
}